

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

mpack_tag_t mpack_peek_tag(mpack_reader_t *reader)

{
  mpack_error_t mVar1;
  size_t sVar2;
  mpack_tag_t mVar3;
  anon_union_8_8_6320e492_for_v local_30;
  mpack_tag_t tag;
  mpack_reader_t *reader_local;
  mpack_type_t local_10;
  
  tag._8_8_ = reader;
  mVar1 = mpack_reader_error(reader);
  if (mVar1 == mpack_ok) {
    mVar1 = mpack_reader_track_peek_element((mpack_reader_t *)tag._8_8_);
    if (mVar1 == mpack_ok) {
      memset(&local_30,0,0x10);
      sVar2 = mpack_parse_tag((mpack_reader_t *)tag._8_8_,(mpack_tag_t *)&local_30.ext);
      if (sVar2 == 0) {
        mVar3 = mpack_tag_nil();
        reader_local = (mpack_reader_t *)mVar3.v;
        local_10 = mVar3.type;
      }
      else {
        reader_local = (mpack_reader_t *)local_30;
        local_10 = tag.v.l;
      }
    }
    else {
      mVar3 = mpack_tag_nil();
      reader_local = (mpack_reader_t *)mVar3.v;
      local_10 = mVar3.type;
    }
  }
  else {
    mVar3 = mpack_tag_nil();
    reader_local = (mpack_reader_t *)mVar3.v;
    local_10 = mVar3.type;
  }
  mVar3.type = local_10;
  mVar3.v = (anon_union_8_8_6320e492_for_v)reader_local;
  mVar3._12_4_ = 0;
  return mVar3;
}

Assistant:

mpack_tag_t mpack_peek_tag(mpack_reader_t* reader) {
    mpack_log("peeking tag\n");

    // make sure we can peek a tag
    if (mpack_reader_error(reader) != mpack_ok)
        return mpack_tag_nil();
    if (mpack_reader_track_peek_element(reader) != mpack_ok)
        return mpack_tag_nil();

    mpack_tag_t tag = MPACK_TAG_ZERO;
    if (mpack_parse_tag(reader, &tag) == 0)
        return mpack_tag_nil();
    return tag;
}